

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void __thiscall
wasm::Walker<wasm::EnforceStackLimits,_wasm::Visitor<wasm::EnforceStackLimits,_void>_>::
walkElementSegment(Walker<wasm::EnforceStackLimits,_wasm::Visitor<wasm::EnforceStackLimits,_void>_>
                   *this,ElementSegment *segment)

{
  pointer ppEVar1;
  pointer ppEVar2;
  Expression *local_30;
  Expression *expr;
  
  if ((segment->table).super_IString.str._M_str != (char *)0x0) {
    walk(this,&segment->offset);
  }
  ppEVar2 = (segment->data).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar1 = (segment->data).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar2 != ppEVar1) {
    do {
      local_30 = *ppEVar2;
      walk(this,&local_30);
      ppEVar2 = ppEVar2 + 1;
    } while (ppEVar2 != ppEVar1);
  }
  return;
}

Assistant:

void walkElementSegment(ElementSegment* segment) {
    if (segment->table.is()) {
      walk(segment->offset);
    }
    for (auto* expr : segment->data) {
      walk(expr);
    }
    static_cast<SubType*>(this)->visitElementSegment(segment);
  }